

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int whereRangeVectorLen(Parse *pParse,int iCur,Index *pIdx,int nEq,WhereTerm *pTerm)

{
  Expr *pEVar1;
  Expr *pExpr;
  char cVar2;
  int iVar3;
  Select *pSVar4;
  CollSeq *pCVar5;
  char cVar6;
  u8 uVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  
  pEVar1 = pTerm->pExpr->pLeft;
  uVar7 = pEVar1->op;
  if (uVar7 == 0xa8) {
    uVar7 = pEVar1->op2;
  }
  if (uVar7 == 0x83) {
    pSVar4 = (pEVar1->x).pSelect;
  }
  else {
    uVar8 = 1;
    if (uVar7 != 0xa9) goto LAB_0019ca0c;
    pSVar4 = (Select *)&pEVar1->x;
  }
  uVar8 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar4->pEList)->pList->nExpr;
LAB_0019ca0c:
  uVar10 = (uint)pIdx->nColumn - nEq;
  if ((int)uVar8 < (int)uVar10) {
    uVar10 = uVar8;
  }
  uVar8 = 1;
  if (1 < (int)uVar10) {
    lVar9 = 0x28;
    lVar11 = 0;
    do {
      pEVar1 = pTerm->pExpr->pRight;
      pSVar4 = (Select *)&pEVar1->x;
      if ((pEVar1->flags & 0x800) != 0) {
        pSVar4 = *(Select **)pSVar4;
      }
      pEVar1 = *(Expr **)((long)((pTerm->pExpr->pLeft->x).pList)->a + lVar9 + -8);
      if ((((pEVar1->op != 0xa2) || (pEVar1->iTable != iCur)) ||
          (pEVar1->iColumn != pIdx->aiColumn[(long)nEq + lVar11 + 1])) ||
         (pIdx->aSortOrder[lVar11 + 1 + (long)nEq] != pIdx->aSortOrder[(uint)nEq])) {
LAB_0019cb59:
        return (int)lVar11 + 1;
      }
      pExpr = *(Expr **)((long)((anon_union_8_2_a01b6dbf_for_x *)&pSVar4->pEList)->pList->a +
                        lVar9 + -8);
      cVar2 = sqlite3ExprAffinity(pEVar1);
      cVar2 = sqlite3CompareAffinity(pExpr,cVar2);
      if ((long)pEVar1->iColumn < 0) {
        cVar6 = 'D';
      }
      else {
        cVar6 = pIdx->pTable->aCol[pEVar1->iColumn].affinity;
      }
      if (((cVar2 != cVar6) ||
          (pCVar5 = sqlite3BinaryCompareCollSeq(pParse,pEVar1,pExpr), pCVar5 == (CollSeq *)0x0)) ||
         (iVar3 = sqlite3StrICmp(pCVar5->zName,pIdx->azColl[(long)nEq + lVar11 + 1]), iVar3 != 0))
      goto LAB_0019cb59;
      lVar11 = lVar11 + 1;
      lVar9 = lVar9 + 0x20;
      uVar8 = uVar10;
    } while ((ulong)uVar10 - 1 != lVar11);
  }
  return uVar8;
}

Assistant:

static int whereRangeVectorLen(
  Parse *pParse,       /* Parsing context */
  int iCur,            /* Cursor open on pIdx */
  Index *pIdx,         /* The index to be used for a inequality constraint */
  int nEq,             /* Number of prior equality constraints on same index */
  WhereTerm *pTerm     /* The vector inequality constraint */
){
  int nCmp = sqlite3ExprVectorSize(pTerm->pExpr->pLeft);
  int i;

  nCmp = MIN(nCmp, (pIdx->nColumn - nEq));
  for(i=1; i<nCmp; i++){
    /* Test if comparison i of pTerm is compatible with column (i+nEq) 
    ** of the index. If not, exit the loop.  */
    char aff;                     /* Comparison affinity */
    char idxaff = 0;              /* Indexed columns affinity */
    CollSeq *pColl;               /* Comparison collation sequence */
    Expr *pLhs = pTerm->pExpr->pLeft->x.pList->a[i].pExpr;
    Expr *pRhs = pTerm->pExpr->pRight;
    if( pRhs->flags & EP_xIsSelect ){
      pRhs = pRhs->x.pSelect->pEList->a[i].pExpr;
    }else{
      pRhs = pRhs->x.pList->a[i].pExpr;
    }

    /* Check that the LHS of the comparison is a column reference to
    ** the right column of the right source table. And that the sort
    ** order of the index column is the same as the sort order of the
    ** leftmost index column.  */
    if( pLhs->op!=TK_COLUMN 
     || pLhs->iTable!=iCur 
     || pLhs->iColumn!=pIdx->aiColumn[i+nEq] 
     || pIdx->aSortOrder[i+nEq]!=pIdx->aSortOrder[nEq]
    ){
      break;
    }

    testcase( pLhs->iColumn==XN_ROWID );
    aff = sqlite3CompareAffinity(pRhs, sqlite3ExprAffinity(pLhs));
    idxaff = sqlite3TableColumnAffinity(pIdx->pTable, pLhs->iColumn);
    if( aff!=idxaff ) break;

    pColl = sqlite3BinaryCompareCollSeq(pParse, pLhs, pRhs);
    if( pColl==0 ) break;
    if( sqlite3StrICmp(pColl->zName, pIdx->azColl[i+nEq]) ) break;
  }
  return i;
}